

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int tf_worker_hook(void *arg1,void *unused)

{
  long lVar1;
  long lVar2;
  pthread_mutex_t *__mutex;
  int iVar3;
  int iVar4;
  MACROBLOCKD *mbd_00;
  long *in_RDI;
  int current_mb_row;
  MB_MODE_INFO **input_mb_mode_info;
  uint8_t *input_buffer [3];
  MACROBLOCKD *mbd;
  int num_planes;
  aom_internal_error_info *error_info;
  MACROBLOCKD *xd;
  pthread_mutex_t *tf_mutex_;
  scale_factors *scale;
  AV1TemporalFilterSync *tf_sync;
  TemporalFilterCtx *tf_ctx;
  ThreadData_conflict *td;
  AV1_COMP *cpi;
  EncWorkerData *thread_data;
  int in_stack_000000e4;
  ThreadData_conflict *in_stack_000000e8;
  AV1_COMP *in_stack_000000f0;
  undefined4 local_90;
  int in_stack_ffffffffffffff74;
  int *in_stack_ffffffffffffff78;
  AV1TemporalFilterSync *in_stack_ffffffffffffff80;
  int local_4;
  
  lVar1 = *in_RDI;
  lVar2 = in_RDI[1];
  __mutex = *(pthread_mutex_t **)(lVar1 + 0x9d180);
  *(long **)(in_RDI[1] + 0x2b90) = in_RDI + 3;
  iVar3 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x1e));
  if (iVar3 == 0) {
    *(undefined4 *)(in_RDI + 0x1d) = 1;
    iVar3 = av1_num_planes((AV1_COMMON *)(lVar1 + 0x3bf80));
    mbd_00 = (MACROBLOCKD *)(lVar2 + 0x1a0);
    tf_save_state(mbd_00,(MB_MODE_INFO ***)&local_90,(uint8_t **)&stack0xffffffffffffff78,iVar3);
    tf_setup_macroblockd
              (mbd_00,(TemporalFilterData *)(lVar2 + 0x25d90),(scale_factors *)(lVar1 + 0x42be8));
    while( true ) {
      iVar4 = tf_get_next_job(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                              in_stack_ffffffffffffff74);
      if (iVar4 == 0) break;
      av1_tf_do_filtering_row(in_stack_000000f0,in_stack_000000e8,in_stack_000000e4);
    }
    tf_restore_state(mbd_00,(MB_MODE_INFO **)CONCAT44(in_stack_ffffffffffffff74,local_90),
                     (uint8_t **)&stack0xffffffffffffff78,iVar3);
    *(undefined4 *)(in_RDI + 0x1d) = 0;
    local_4 = 1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x1d) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)(lVar1 + 0x9d18c) = 1;
    pthread_mutex_unlock(__mutex);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int tf_worker_hook(void *arg1, void *unused) {
  (void)unused;
  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1_COMP *cpi = thread_data->cpi;
  ThreadData *td = thread_data->td;
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  AV1TemporalFilterSync *tf_sync = &cpi->mt_info.tf_sync;
  const struct scale_factors *scale = &cpi->tf_ctx.sf;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *tf_mutex_ = tf_sync->mutex_;
#endif
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(tf_mutex_);
    tf_sync->tf_mt_exit = true;
    pthread_mutex_unlock(tf_mutex_);
#endif
    return 0;
  }
  error_info->setjmp = 1;

  const int num_planes = av1_num_planes(&cpi->common);
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);

  MACROBLOCKD *mbd = &td->mb.e_mbd;
  uint8_t *input_buffer[MAX_MB_PLANE];
  MB_MODE_INFO **input_mb_mode_info;
  tf_save_state(mbd, &input_mb_mode_info, input_buffer, num_planes);
  tf_setup_macroblockd(mbd, &td->tf_data, scale);

  int current_mb_row = -1;

  while (tf_get_next_job(tf_sync, &current_mb_row, tf_ctx->mb_rows))
    av1_tf_do_filtering_row(cpi, td, current_mb_row);

  tf_restore_state(mbd, input_mb_mode_info, input_buffer, num_planes);

  error_info->setjmp = 0;
  return 1;
}